

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O0

void InfoCallback(SSL *ssl,int type,int value)

{
  FILE *__stream;
  char *pcVar1;
  int value_local;
  int type_local;
  SSL *ssl_local;
  
  __stream = _stderr;
  if (type == 0x10) {
    fprintf(_stderr,"Handshake started.\n");
  }
  else if (type == 0x20) {
    fprintf(_stderr,"Handshake done.\n");
  }
  else if (type == 0x2001) {
    pcVar1 = SSL_state_string_long((SSL *)ssl);
    fprintf(__stream,"Handshake progress: %s\n",pcVar1);
  }
  return;
}

Assistant:

static void InfoCallback(const SSL *ssl, int type, int value) {
  switch (type) {
    case SSL_CB_HANDSHAKE_START:
      fprintf(stderr, "Handshake started.\n");
      break;
    case SSL_CB_HANDSHAKE_DONE:
      fprintf(stderr, "Handshake done.\n");
      break;
    case SSL_CB_CONNECT_LOOP:
      fprintf(stderr, "Handshake progress: %s\n", SSL_state_string_long(ssl));
      break;
  }
}